

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.h
# Opt level: O3

void __thiscall
ScriptCompression::Ser<DataStream>(ScriptCompression *this,DataStream *s,CScript *script)

{
  CScript *pCVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  long in_FS_OFFSET;
  direct_or_indirect local_48;
  uint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = 0;
  local_48._24_8_ = 0;
  local_48.indirect_contents.indirect = (char *)0x0;
  local_48._8_8_ = 0;
  local_48.direct[0x20] = '\0';
  local_24 = 0;
  bVar3 = CompressScript(script,(CompressedScript *)&local_48.indirect_contents);
  if (bVar3) {
    uVar4 = local_24 - 0x22;
    uVar2 = local_48.indirect_contents.indirect;
    if (local_24 < 0x22) {
      uVar4 = local_24;
      uVar2 = &local_48;
    }
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
               (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
               .super__Vector_impl_data._M_finish,uVar2,(char *)(uVar2 + (ulong)uVar4));
  }
  else {
    uVar4 = (script->super_CScriptBase)._size;
    uVar5 = uVar4 - 0x1d;
    if (uVar4 < 0x1d) {
      uVar5 = uVar4;
    }
    WriteVarInt<DataStream,(VarIntMode)0,unsigned_int>(s,uVar5 + 6);
    uVar4 = (script->super_CScriptBase)._size;
    uVar5 = uVar4 - 0x1d;
    pCVar1 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    if (uVar4 < 0x1d) {
      uVar5 = uVar4;
      pCVar1 = script;
    }
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
               (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
               .super__Vector_impl_data._M_finish,pCVar1,
               (long)&(pCVar1->super_CScriptBase)._union + (ulong)uVar5);
  }
  if (0x21 < local_24) {
    free(local_48.indirect_contents.indirect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream &s, const CScript& script) {
        CompressedScript compr;
        if (CompressScript(script, compr)) {
            s << Span{compr};
            return;
        }
        unsigned int nSize = script.size() + nSpecialScripts;
        s << VARINT(nSize);
        s << Span{script};
    }